

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_interp_CC_to_FaceCentroid
               (MultiFab *cc,MultiFab *fc_x,MultiFab *fc_y,MultiFab *fc_z,int scomp,int dcomp,
               int ncomp,Geometry *a_geom,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_bcs
               )

{
  int iVar1;
  int iVar2;
  pointer pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double *pdVar6;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double *pdVar16;
  Long LVar17;
  Long LVar18;
  Long LVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  FabType FVar22;
  FabType FVar23;
  long lVar24;
  int *piVar25;
  int *piVar26;
  Periodicity PVar27;
  Box txbx;
  Box txbx_1;
  Box result;
  MFIter mfi;
  Array4<const_double> local_538;
  FabArray<amrex::FArrayBox> *local_4f8;
  FabArray<amrex::EBCellFlagFab> *local_4f0;
  double *local_4e8 [5];
  undefined8 *local_4c0;
  undefined1 local_4b8 [32];
  Long local_498;
  undefined8 uStack_484;
  undefined1 local_478 [28];
  undefined4 uStack_45c;
  Long LStack_458;
  int iStack_450;
  int local_44c;
  int iStack_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_428;
  undefined4 uStack_424;
  double *pdStack_420;
  Long LStack_418;
  int iStack_410;
  int local_40c;
  int iStack_408;
  int iStack_404;
  int iStack_400;
  int iStack_3fc;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int iStack_3e8;
  int iStack_3e4;
  double *local_3e0;
  int iStack_3d8;
  Long local_3d0;
  Long LStack_3c8;
  Dim3 aDStack_3c0 [2];
  int iStack_3a8;
  double *local_3a0;
  int local_398;
  undefined8 local_390 [9];
  double *local_348 [3];
  double *local_32c [3];
  double *local_310 [3];
  Box local_2f4;
  MultiCutFab *local_2d8;
  MultiCutFab *local_2d0;
  MultiCutFab *local_2c8;
  MultiCutFab *local_2c0;
  MultiCutFab *local_2b8;
  MultiCutFab *local_2b0;
  Array4<double> local_2a8;
  Array4<double> local_268;
  Array4<double> local_228;
  MFIter local_1e8;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_double> local_88;
  MFItInfo local_44;
  
  local_4f8 = &cc->super_FabArray<amrex::FArrayBox>;
  lVar24 = __dynamic_cast((cc->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                          &EBFArrayBoxFactory::typeinfo,0);
  if (lVar24 == 0) {
    __cxa_bad_cast();
  }
  local_4f0 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar24 + 0xd8));
  EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar24 + 0xd8));
  EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar24 + 0xd8));
  if (((long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (long)ncomp != 0) {
    Assert_host("a_bcs.size() == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
                ,0x39c,(char *)0x0);
  }
  uVar5 = *(undefined8 *)(a_geom->domain).smallend.vect;
  iVar1 = (a_geom->domain).smallend.vect[2];
  pdVar6 = *(double **)(a_geom->domain).bigend.vect;
  iVar2 = (a_geom->domain).bigend.vect[2];
  local_478._0_4_ = 0;
  local_478._4_4_ = 0;
  local_478._8_4_ = 0;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fc_x->super_FabArray<amrex::FArrayBox>,1e+30,dcomp,ncomp,(IntVect *)local_478);
  local_478._0_4_ = 0;
  local_478._4_4_ = 0;
  local_478._8_4_ = 0;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fc_y->super_FabArray<amrex::FArrayBox>,1e+30,dcomp,ncomp,(IntVect *)local_478);
  local_478._0_4_ = 0;
  local_478._4_4_ = 0;
  local_478._8_4_ = 0;
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fc_z->super_FabArray<amrex::FArrayBox>,1e+30,dcomp,ncomp,(IntVect *)local_478);
  pBVar3 = (a_bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
           super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_44.do_tiling = false;
  local_44.dynamic = true;
  local_44.device_sync = true;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.tilesize.vect[0] = 0;
  local_44.tilesize.vect[1] = 0;
  local_44.tilesize.vect[2] = 0;
  MFIter::MFIter(&local_1e8,&local_4f8->super_FabArrayBase,&local_44);
  if (local_1e8.currentIndex < local_1e8.endIndex) {
    local_4c0 = local_390;
    do {
      piVar26 = &local_1e8.currentIndex;
      MFIter::tilebox(&local_2f4,&local_1e8);
      MFIter::nodaltilebox((Box *)local_310,&local_1e8,0);
      MFIter::nodaltilebox((Box *)local_32c,&local_1e8,1);
      MFIter::nodaltilebox((Box *)local_348,&local_1e8,2);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_538,local_4f8,&local_1e8,scomp);
      piVar25 = piVar26;
      if (local_1e8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar25 = ((local_1e8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_1e8.currentIndex;
      }
      local_478._20_4_ = local_2f4.bigend.vect[2];
      local_478._24_4_ = local_2f4.btype.itype;
      local_478._0_4_ = local_2f4.smallend.vect[0];
      local_478._4_4_ = local_2f4.smallend.vect[1];
      FVar22 = EBCellFlagFab::getType
                         ((local_4f0->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar25],(Box *)local_478);
      if (local_1e8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar26 = ((local_1e8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_1e8.currentIndex;
      }
      local_478._20_4_ = local_2f4.bigend.vect[2];
      local_478._24_4_ = local_2f4.btype.itype;
      local_478._0_4_ = local_2f4.smallend.vect[0];
      local_478._4_4_ = local_2f4.smallend.vect[1];
      local_478._0_4_ = local_478._0_4_ + -4;
      local_478._4_4_ = local_478._4_4_ + -4;
      local_478._8_4_ = local_2f4.smallend.vect[2] + -4;
      local_478._12_4_ = local_2f4.bigend.vect[0] + 4;
      local_478._16_4_ = local_2f4.bigend.vect[1] + 4;
      local_478._20_4_ = local_478._20_4_ + 4;
      FVar23 = EBCellFlagFab::getType
                         ((local_4f0->m_fabs_v).
                          super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[*piVar26],(Box *)local_478);
      if (FVar22 != covered) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_228,&fc_x->super_FabArray<amrex::FArrayBox>,&local_1e8,dcomp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_268,&fc_y->super_FabArray<amrex::FArrayBox>,&local_1e8,dcomp);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_2a8,&fc_z->super_FabArray<amrex::FArrayBox>,&local_1e8,dcomp);
        iVar14 = iStack_3e4;
        iVar12 = iStack_3e8;
        iVar10 = iStack_3f4;
        iVar8 = local_3f8;
        local_3f8 = (int)uVar5;
        iVar9 = local_3f8;
        iStack_3f4 = (int)((ulong)uVar5 >> 0x20);
        iVar11 = iStack_3f4;
        iStack_3e8 = (int)pBVar3;
        iVar13 = iStack_3e8;
        iStack_3e4 = (int)((ulong)pBVar3 >> 0x20);
        iVar15 = iStack_3e4;
        if (FVar23 == regular) {
          local_4b8._20_4_ = (undefined4)stack0xfffffffffffffd04;
          local_4b8._24_4_ = SUB84(stack0xfffffffffffffd04,4);
          local_4b8._0_8_ = local_310[0];
          iStack_42c = local_228.end.z;
          local_428 = local_228.ncomp;
          iStack_440 = local_228.begin.x;
          iStack_43c = local_228.begin.y;
          iStack_450 = (int)local_228.kstride;
          local_44c = (int)((ulong)local_228.kstride >> 0x20);
          iStack_448 = (int)local_228.nstride;
          iStack_444 = (int)((ulong)local_228.nstride >> 0x20);
          local_478._24_4_ = SUB84(local_228.p,0);
          uStack_45c = (undefined4)((ulong)local_228.p >> 0x20);
          LStack_458 = local_228.jstride;
          iStack_3ec = local_538.end.z;
          iStack_3e8 = local_538.ncomp;
          iStack_400 = local_538.begin.x;
          iStack_3fc = local_538.begin.y;
          iStack_410 = (int)local_538.kstride;
          local_40c = (int)((ulong)local_538.kstride >> 0x20);
          iStack_408 = (int)local_538.nstride;
          iStack_404 = (int)((ulong)local_538.nstride >> 0x20);
          pdStack_420 = local_538.p;
          LStack_418 = local_538.jstride;
          local_478._0_4_ = local_3f8;
          local_478._4_4_ = iStack_3f4;
          local_478._8_4_ = iVar1;
          local_478._16_4_ = iVar13;
          local_478._20_4_ = iStack_3e4;
          iStack_3e4 = iVar14;
          local_3e0 = pdVar6;
          iStack_3d8 = iVar2;
          Loop<amrex::eb_interp_cc2face_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_4b8,ncomp,(anon_class_168_5_9f62599b *)local_478);
          local_4b8._20_4_ = (undefined4)stack0xfffffffffffffce8;
          local_4b8._24_4_ = SUB84(stack0xfffffffffffffce8,4);
          local_4b8._0_8_ = local_32c[0];
          iStack_42c = local_268.end.z;
          local_428 = local_268.ncomp;
          iStack_440 = local_268.begin.x;
          iStack_43c = local_268.begin.y;
          iStack_450 = (int)local_268.kstride;
          local_44c = (int)((ulong)local_268.kstride >> 0x20);
          iStack_448 = (int)local_268.nstride;
          iStack_444 = (int)((ulong)local_268.nstride >> 0x20);
          local_478._24_4_ = SUB84(local_268.p,0);
          uStack_45c = (undefined4)((ulong)local_268.p >> 0x20);
          LStack_458 = local_268.jstride;
          iStack_3ec = local_538.end.z;
          iStack_3e8 = local_538.ncomp;
          iStack_400 = local_538.begin.x;
          iStack_3fc = local_538.begin.y;
          iStack_410 = (int)local_538.kstride;
          local_40c = (int)((ulong)local_538.kstride >> 0x20);
          iStack_408 = (int)local_538.nstride;
          iStack_404 = (int)((ulong)local_538.nstride >> 0x20);
          pdStack_420 = local_538.p;
          LStack_418 = local_538.jstride;
          local_478._0_4_ = local_3f8;
          local_478._4_4_ = iStack_3f4;
          local_478._8_4_ = iVar1;
          local_478._16_4_ = iVar13;
          local_478._20_4_ = iVar15;
          local_3e0 = pdVar6;
          iStack_3d8 = iVar2;
          Loop<amrex::eb_interp_cc2face_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_4b8,ncomp,(anon_class_168_5_9f625d5c *)local_478);
          local_4b8._20_4_ = (undefined4)stack0xfffffffffffffccc;
          local_4b8._24_4_ = SUB84(stack0xfffffffffffffccc,4);
          local_4b8._0_8_ = local_348[0];
          iStack_430 = local_2a8.end.y;
          iStack_42c = local_2a8.end.z;
          local_428 = local_2a8.ncomp;
          iStack_440 = local_2a8.begin.x;
          iStack_43c = local_2a8.begin.y;
          local_438 = local_2a8.begin.z;
          iStack_434 = local_2a8.end.x;
          iStack_450 = (int)local_2a8.kstride;
          local_44c = (int)((ulong)local_2a8.kstride >> 0x20);
          iStack_448 = (int)local_2a8.nstride;
          iStack_444 = (int)((ulong)local_2a8.nstride >> 0x20);
          local_478._24_4_ = SUB84(local_2a8.p,0);
          uStack_45c = (undefined4)((ulong)local_2a8.p >> 0x20);
          LStack_458 = local_2a8.jstride;
          iStack_3f0 = local_538.end.y;
          iStack_3ec = local_538.end.z;
          iStack_3e8 = local_538.ncomp;
          iStack_400 = local_538.begin.x;
          iStack_3fc = local_538.begin.y;
          local_3f8 = local_538.begin.z;
          iStack_3f4 = local_538.end.x;
          iStack_410 = (int)local_538.kstride;
          local_40c = (int)((ulong)local_538.kstride >> 0x20);
          iStack_408 = (int)local_538.nstride;
          iStack_404 = (int)((ulong)local_538.nstride >> 0x20);
          pdStack_420 = local_538.p;
          LStack_418 = local_538.jstride;
          local_478._0_4_ = iVar9;
          local_478._4_4_ = iVar11;
          local_478._8_4_ = iVar1;
          local_478._16_4_ = iVar13;
          local_478._20_4_ = iVar15;
          local_3e0 = pdVar6;
          iStack_3d8 = iVar2;
          Loop<amrex::eb_interp_cc2face_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_4b8,ncomp,(anon_class_168_5_9f62611d *)local_478);
        }
        else {
          local_3f8 = iVar8;
          iStack_3f4 = iVar10;
          iStack_3e8 = iVar12;
          iStack_3e4 = iVar14;
          MultiCutFab::const_array((Array4<const_double> *)local_4b8,local_2c0,&local_1e8);
          MultiCutFab::const_array(&local_88,local_2b8,&local_1e8);
          MultiCutFab::const_array(&local_c8,local_2b0,&local_1e8);
          MultiCutFab::const_array(&local_108,local_2d8,&local_1e8);
          MultiCutFab::const_array(&local_148,local_2d0,&local_1e8);
          MultiCutFab::const_array(&local_188,local_2c8,&local_1e8);
          uVar21 = local_108._52_8_;
          uVar20 = local_108.begin._0_8_;
          LVar19 = local_108.nstride;
          LVar18 = local_108.kstride;
          LVar17 = local_108.jstride;
          pdVar16 = local_108.p;
          puVar7 = local_4c0;
          local_4e8._20_8_ = stack0xfffffffffffffd04;
          local_4e8[0] = local_310[0];
          iStack_444 = (int)uStack_484;
          iStack_440 = SUB84(uStack_484,4);
          LStack_458 = local_498;
          local_478._20_4_ = local_4b8._20_4_;
          local_478._24_4_ = local_4b8._24_4_;
          local_478._0_4_ = (undefined4)local_4b8._0_8_;
          local_478._4_4_ = SUB84(local_4b8._0_8_,4);
          iStack_404 = local_228.end.z;
          iStack_400 = local_228.ncomp;
          LStack_418._0_4_ = local_228.begin.x;
          LStack_418._4_4_ = local_228.begin.y;
          local_428 = (int)local_228.kstride;
          uStack_424 = (undefined4)((ulong)local_228.kstride >> 0x20);
          pdStack_420 = (double *)local_228.nstride;
          local_438 = (int)local_228.p;
          iStack_434 = (int)((ulong)local_228.p >> 0x20);
          iStack_430 = (int)local_228.jstride;
          iStack_42c = (int)((ulong)local_228.jstride >> 0x20);
          aDStack_3c0[1].z = local_538.end.z;
          iStack_3a8 = local_538.ncomp;
          aDStack_3c0[0].x = local_538.begin.x;
          aDStack_3c0[0].y = local_538.begin.y;
          local_3d0 = local_538.kstride;
          LStack_3c8 = local_538.nstride;
          iStack_3d8 = (int)local_538.jstride;
          uVar4 = CONCAT44(local_108.end.x,local_108.begin.z);
          *(ulong *)((long)local_4c0 + 0x2c) = CONCAT44(local_108.end.y,local_108.end.x);
          *(undefined8 *)((long)local_4c0 + 0x34) = uVar21;
          local_4c0[4] = uVar20;
          local_4c0[5] = uVar4;
          local_4c0[2] = LVar18;
          local_4c0[3] = LVar19;
          *local_4c0 = pdVar16;
          local_4c0[1] = LVar17;
          local_3f8 = iVar9;
          iStack_3f4 = iVar11;
          iStack_3f0 = iVar1;
          iStack_3e8 = iVar13;
          iStack_3e4 = iVar15;
          local_3a0 = pdVar6;
          local_398 = iVar2;
          Loop<amrex::eb_interp_cc2facecent_x(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_4e8,ncomp,(anon_class_296_7_5d001a28 *)local_478);
          uVar21 = local_148._52_8_;
          uVar20 = local_148.begin._0_8_;
          LVar19 = local_148.nstride;
          LVar18 = local_148.kstride;
          LVar17 = local_148.jstride;
          pdVar16 = local_148.p;
          local_4e8._20_8_ = stack0xfffffffffffffce8;
          local_4e8[0] = local_32c[0];
          iStack_444 = local_88.end.z;
          iStack_440 = local_88.ncomp;
          LStack_458._0_4_ = local_88.begin.x;
          LStack_458._4_4_ = local_88.begin.y;
          local_478._16_4_ = (undefined4)local_88.kstride;
          local_478._20_4_ = (undefined4)((ulong)local_88.kstride >> 0x20);
          local_478._24_4_ = (undefined4)local_88.nstride;
          uStack_45c = (undefined4)((ulong)local_88.nstride >> 0x20);
          local_478._0_4_ = SUB84(local_88.p,0);
          local_478._4_4_ = (undefined4)((ulong)local_88.p >> 0x20);
          local_478._8_4_ = (undefined4)local_88.jstride;
          local_478._12_4_ = (undefined4)((ulong)local_88.jstride >> 0x20);
          iStack_404 = local_268.end.z;
          iStack_400 = local_268.ncomp;
          LStack_418._0_4_ = local_268.begin.x;
          LStack_418._4_4_ = local_268.begin.y;
          local_428 = (int)local_268.kstride;
          uStack_424 = (undefined4)((ulong)local_268.kstride >> 0x20);
          pdStack_420 = (double *)local_268.nstride;
          local_438 = (int)local_268.p;
          iStack_434 = (int)((ulong)local_268.p >> 0x20);
          iStack_430 = (int)local_268.jstride;
          iStack_42c = (int)((ulong)local_268.jstride >> 0x20);
          aDStack_3c0[1].z = local_538.end.z;
          iStack_3a8 = local_538.ncomp;
          aDStack_3c0[0].x = local_538.begin.x;
          aDStack_3c0[0].y = local_538.begin.y;
          local_3d0 = local_538.kstride;
          LStack_3c8 = local_538.nstride;
          iStack_3d8 = (int)local_538.jstride;
          uVar4 = CONCAT44(local_148.end.x,local_148.begin.z);
          *(ulong *)((long)puVar7 + 0x2c) = CONCAT44(local_148.end.y,local_148.end.x);
          *(undefined8 *)((long)puVar7 + 0x34) = uVar21;
          puVar7[4] = uVar20;
          puVar7[5] = uVar4;
          puVar7[2] = LVar18;
          puVar7[3] = LVar19;
          *puVar7 = pdVar16;
          puVar7[1] = LVar17;
          local_3f8 = iVar9;
          iStack_3f4 = iVar11;
          iStack_3f0 = iVar1;
          iStack_3e8 = iVar13;
          iStack_3e4 = iVar15;
          local_3a0 = pdVar6;
          local_398 = iVar2;
          Loop<amrex::eb_interp_cc2facecent_y(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_4e8,ncomp,(anon_class_296_7_939b2e09 *)local_478);
          uVar21 = local_188._52_8_;
          uVar20 = local_188.begin._0_8_;
          LVar19 = local_188.nstride;
          LVar18 = local_188.kstride;
          LVar17 = local_188.jstride;
          pdVar16 = local_188.p;
          local_4e8._20_8_ = stack0xfffffffffffffccc;
          local_4e8[0] = local_348[0];
          iStack_448 = local_c8.end.y;
          iStack_444 = local_c8.end.z;
          iStack_440 = local_c8.ncomp;
          LStack_458._0_4_ = local_c8.begin.x;
          LStack_458._4_4_ = local_c8.begin.y;
          iStack_450 = local_c8.begin.z;
          local_44c = local_c8.end.x;
          local_478._16_4_ = (undefined4)local_c8.kstride;
          local_478._20_4_ = (undefined4)((ulong)local_c8.kstride >> 0x20);
          local_478._24_4_ = (undefined4)local_c8.nstride;
          uStack_45c = (undefined4)((ulong)local_c8.nstride >> 0x20);
          local_478._0_4_ = SUB84(local_c8.p,0);
          local_478._4_4_ = (undefined4)((ulong)local_c8.p >> 0x20);
          local_478._8_4_ = (undefined4)local_c8.jstride;
          local_478._12_4_ = (undefined4)((ulong)local_c8.jstride >> 0x20);
          iStack_408 = local_2a8.end.y;
          iStack_404 = local_2a8.end.z;
          iStack_400 = local_2a8.ncomp;
          LStack_418._0_4_ = local_2a8.begin.x;
          LStack_418._4_4_ = local_2a8.begin.y;
          iStack_410 = local_2a8.begin.z;
          local_40c = local_2a8.end.x;
          local_428 = (int)local_2a8.kstride;
          uStack_424 = (undefined4)((ulong)local_2a8.kstride >> 0x20);
          pdStack_420 = (double *)local_2a8.nstride;
          local_438 = (int)local_2a8.p;
          iStack_434 = (int)((ulong)local_2a8.p >> 0x20);
          iStack_430 = (int)local_2a8.jstride;
          iStack_42c = (int)((ulong)local_2a8.jstride >> 0x20);
          aDStack_3c0[1].z = local_538.end.z;
          iStack_3a8 = local_538.ncomp;
          aDStack_3c0[0].x = local_538.begin.x;
          aDStack_3c0[0].y = local_538.begin.y;
          local_3d0 = local_538.kstride;
          LStack_3c8 = local_538.nstride;
          local_3e0 = local_538.p;
          iStack_3d8 = (int)local_538.jstride;
          uVar4 = CONCAT44(local_188.end.x,local_188.begin.z);
          *(ulong *)((long)puVar7 + 0x2c) = CONCAT44(local_188.end.y,local_188.end.x);
          *(undefined8 *)((long)puVar7 + 0x34) = uVar21;
          puVar7[4] = uVar20;
          puVar7[5] = uVar4;
          puVar7[2] = LVar18;
          puVar7[3] = LVar19;
          *puVar7 = pdVar16;
          puVar7[1] = LVar17;
          local_3f8 = iVar9;
          iStack_3f4 = iVar11;
          iStack_3f0 = iVar1;
          iStack_3e8 = iVar13;
          iStack_3e4 = iVar15;
          local_3a0 = pdVar6;
          local_398 = iVar2;
          Loop<amrex::eb_interp_cc2facecent_z(amrex::Box_const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,int,amrex::Box_const&,amrex::BCRec_const*)::_lambda(int,int,int,int)_1_>
                    ((Box *)local_4e8,ncomp,(anon_class_296_7_ca3641ea *)local_478);
        }
      }
      MFIter::operator++(&local_1e8);
    } while (local_1e8.currentIndex < local_1e8.endIndex);
  }
  MFIter::~MFIter(&local_1e8);
  PVar27 = Geometry::periodicity(a_geom);
  local_478._0_4_ = PVar27.period.vect[0];
  local_478._4_4_ = PVar27.period.vect[1];
  local_478._8_4_ = PVar27.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&fc_x->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_478,false);
  PVar27 = Geometry::periodicity(a_geom);
  local_478._0_4_ = PVar27.period.vect[0];
  local_478._4_4_ = PVar27.period.vect[1];
  local_478._8_4_ = PVar27.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&fc_y->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_478,false);
  PVar27 = Geometry::periodicity(a_geom);
  local_478._0_4_ = PVar27.period.vect[0];
  local_478._4_4_ = PVar27.period.vect[1];
  local_478._8_4_ = PVar27.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&fc_z->super_FabArray<amrex::FArrayBox>,(Periodicity *)local_478,false);
  return;
}

Assistant:

void
EB_interp_CC_to_FaceCentroid (const MultiFab& cc,
                              AMREX_D_DECL( MultiFab& fc_x,
                                            MultiFab& fc_y,
                                            MultiFab& fc_z),
                              int scomp, int dcomp, int ncomp,
                              const Geometry& a_geom,
                              const Vector<BCRec>& a_bcs)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(cc.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& area = factory.getAreaFrac();
    const auto& fcent = factory.getFaceCent();

    AMREX_ALWAYS_ASSERT(a_bcs.size() == ncomp );

    Box domain(a_geom.Domain());

    const int nghost(4);

   // Initialize edge state
    AMREX_D_TERM(fc_x.setVal(1e30_rt,dcomp,ncomp);,
                 fc_y.setVal(1e30_rt,dcomp,ncomp);,
                 fc_z.setVal(1e30_rt,dcomp,ncomp));

    BCRec const* d_bcs;
#ifdef AMREX_USE_GPU
    Gpu::DeviceVector<BCRec> dv_bcs(ncomp);
    if (Gpu::inLaunchRegion())
    {
        Gpu::copy(Gpu::hostToDevice, a_bcs.begin(), a_bcs.begin()+ncomp, dv_bcs.begin());
        d_bcs = dv_bcs.dataPtr();
    }
    else
#endif
    {
        d_bcs = a_bcs.dataPtr();
    }

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cc, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.tilebox();
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2));
        const auto& ccfab = cc.array(mfi,scomp);
        const auto fabtyp = flags[mfi].getType(amrex::grow(vbx,0));
        const auto fabtyp_ghost = flags[mfi].getType(amrex::grow(vbx,nghost));

        if (fabtyp != FabType::covered)
        {
            AMREX_D_TERM(Array4<Real> const& edg_x = fc_x.array(mfi,dcomp);,
                         Array4<Real> const& edg_y = fc_y.array(mfi,dcomp);,
                         Array4<Real> const& edg_z = fc_z.array(mfi,dcomp));

            if (fabtyp_ghost == FabType::regular )
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2face_x(txbx, ccfab, edg_x, ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2face_y(tybx, ccfab, edg_y, ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2face_z(tzbx, ccfab, edg_z, ncomp, domain, d_bcs);
                     });
            }
            else
            {
                AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                             Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                             Array4<Real const> const& apzfab = area[2]->const_array(mfi));
                AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                             Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                             Array4<Real const> const& fcz = fcent[2]->const_array(mfi));

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM
                    (xbx, txbx,
                     {
                         eb_interp_cc2facecent_x(txbx, ccfab, apxfab, fcx, edg_x,
                                                 ncomp, domain, d_bcs);
                     },
                     ybx, tybx,
                     {
                         eb_interp_cc2facecent_y(tybx, ccfab, apyfab, fcy, edg_y,
                                                 ncomp, domain, d_bcs);
                     },
                     zbx, tzbx,
                     {
                         eb_interp_cc2facecent_z(tzbx, ccfab, apzfab, fcz, edg_z,
                                                 ncomp, domain, d_bcs);
                     });
            }
        }
    }

    fc_x.FillBoundary(a_geom.periodicity());
    fc_y.FillBoundary(a_geom.periodicity());
#if ( AMREX_SPACEDIM == 3 )
    fc_z.FillBoundary(a_geom.periodicity());
#endif

}